

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionParser.cpp
# Opt level: O2

unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
exclusiveOrExpression(Tokenizer *tokenizer)

{
  undefined8 __p;
  undefined8 uVar1;
  Token *pTVar2;
  Tokenizer *in_RSI;
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> exp;
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> exp2;
  _List_node_base *local_58;
  undefined1 local_50 [32];
  
  andExpression((Tokenizer *)local_50);
  if ((ExpressionInternal *)local_50._0_8_ == (ExpressionInternal *)0x0) {
    (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)0x0;
  }
  else {
    local_58 = (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
               super__List_node_base._M_next;
    do {
      pTVar2 = Tokenizer::peekToken(in_RSI,0);
      if (pTVar2->type != Caret) {
        (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
        super__List_node_base._M_next = (_List_node_base *)local_50._0_8_;
        local_50._0_8_ = (ExpressionInternal *)0x0;
        goto LAB_0013dc9b;
      }
      Tokenizer::eatToken(in_RSI);
      andExpression((Tokenizer *)(local_50 + 0x18));
      uVar1 = local_50._24_8_;
      if ((_List_node_base *)local_50._24_8_ == (_List_node_base *)0x0) {
        local_58 = (_List_node_base *)0x0;
      }
      else {
        local_50._12_4_ = 0x17;
        std::
        make_unique<ExpressionInternal,OperatorType,std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>,std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>
                  ((OperatorType *)(local_50 + 0x10),
                   (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                   (local_50 + 0xc),
                   (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                   local_50);
        __p = local_50._16_8_;
        local_50._16_8_ = (pointer)0x0;
        std::__uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::reset
                  ((__uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                   local_50,(pointer)__p);
        std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
                  ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                   (local_50 + 0x10));
      }
      std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
                ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                 (local_50 + 0x18));
    } while ((_List_node_base *)uVar1 != (_List_node_base *)0x0);
    (tokenizer->tokens).super__List_base<Token,_std::allocator<Token>_>._M_impl._M_node.
    super__List_node_base._M_next = local_58;
  }
LAB_0013dc9b:
  std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
            ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)local_50);
  return (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         tokenizer;
}

Assistant:

static std::unique_ptr<ExpressionInternal> exclusiveOrExpression(Tokenizer& tokenizer)
{
	std::unique_ptr<ExpressionInternal> exp = andExpression(tokenizer);
	if (exp == nullptr)
		return nullptr;

	while (tokenizer.peekToken().type == TokenType::Caret)
	{
		tokenizer.eatToken();

		std::unique_ptr<ExpressionInternal> exp2 = andExpression(tokenizer);
		if (exp2 == nullptr)
			return nullptr;

		exp = std::make_unique<ExpressionInternal>(OperatorType::Xor, std::move(exp), std::move(exp2));
	}

	return exp;
}